

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Output::flowKey(Output *this,StringRef Key)

{
  reference pIVar1;
  int I;
  int iVar2;
  StringRef s;
  StringRef s_00;
  StringRef s_01;
  StringRef s_02;
  StringRef s_03;
  
  pIVar1 = SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void>::back
                     ((SmallVectorTemplateCommon<llvm::yaml::Output::InState,_void> *)
                      &this->StateStack);
  if (*pIVar1 == inFlowMapOtherKey) {
    s.Length = 2;
    s.Data = ", ";
    output(this,s);
  }
  if ((this->WrapColumn != 0) && (this->WrapColumn < this->Column)) {
    s_00.Length = 1;
    s_00.Data = "\n";
    output(this,s_00);
    for (iVar2 = 0; iVar2 < this->ColumnAtMapFlowStart; iVar2 = iVar2 + 1) {
      s_01.Length = 1;
      s_01.Data = " ";
      output(this,s_01);
    }
    this->Column = this->ColumnAtMapFlowStart;
    s_02.Length = 2;
    s_02.Data = "  ";
    output(this,s_02);
  }
  output(this,Key);
  s_03.Length = 2;
  s_03.Data = ": ";
  output(this,s_03);
  return;
}

Assistant:

void Output::flowKey(StringRef Key) {
  if (StateStack.back() == inFlowMapOtherKey)
    output(", ");
  if (WrapColumn && Column > WrapColumn) {
    output("\n");
    for (int I = 0; I < ColumnAtMapFlowStart; ++I)
      output(" ");
    Column = ColumnAtMapFlowStart;
    output("  ");
  }
  output(Key);
  output(": ");
}